

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void markold(global_State *g,GCObject *from,GCObject *to)

{
  byte bVar1;
  
  if (from != to) {
    do {
      bVar1 = from->marked;
      if ((bVar1 & 7) == 3) {
        if ((bVar1 & 0x18) != 0) {
          __assert_fail("!(((p)->marked) & (((1<<(3)) | (1<<(4)))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x523,"void markold(global_State *, GCObject *, GCObject *)");
        }
        from->marked = bVar1 ^ 7;
        if ((bVar1 & 0x20) != 0) {
          reallymarkobject(g,from);
        }
      }
      from = from->next;
    } while (from != to);
  }
  return;
}

Assistant:

static void markold (global_State *g, GCObject *from, GCObject *to) {
  GCObject *p;
  for (p = from; p != to; p = p->next) {
    if (getage(p) == G_OLD1) {
      lua_assert(!iswhite(p));
      changeage(p, G_OLD1, G_OLD);  /* now they are old */
      if (isblack(p))
        reallymarkobject(g, p);
    }
  }
}